

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseExprList(WastParser *this,ExprList *exprs)

{
  Expr *pEVar1;
  Expr *pEVar2;
  bool bVar3;
  Result RVar4;
  Expr *pEVar5;
  Enum EVar6;
  ExprList *pEVar7;
  iterator pos;
  _Head_base<0UL,_wabt::Expr_*,_false> local_50;
  ExprList local_48;
  
  local_48.first_ = (Expr *)0x0;
  local_48.last_ = (Expr *)0x0;
  local_48.size_ = 0;
  bVar3 = PeekMatchExpr(this);
  EVar6 = Ok;
  if (bVar3) {
    do {
      RVar4 = ParseExpr(this,&local_48);
      pEVar5 = local_48.first_;
      if (RVar4.enum_ == Ok) {
        while (pEVar5 != (Expr *)0x0) {
          if (local_48.size_ == 0) {
            __assert_fail("!empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                          ,0x221,
                          "std::unique_ptr<T> wabt::intrusive_list<wabt::Expr>::extract(iterator) [T = wabt::Expr]"
                         );
          }
          pEVar2 = (pEVar5->super_intrusive_list_base<wabt::Expr>).next_;
          if (local_48.first_ == local_48.last_) {
            local_48.first_ = (Expr *)0x0;
            local_48.last_ = (Expr *)0x0;
            pEVar1 = local_48.last_;
          }
          else {
            pEVar1 = (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_;
            pEVar7 = (ExprList *)&pEVar1->super_intrusive_list_base<wabt::Expr>;
            if (pEVar1 == (Expr *)0x0) {
              pEVar7 = &local_48;
            }
            pEVar7->first_ = pEVar2;
            if (pEVar2 != (Expr *)0x0) {
              (pEVar2->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar1;
              pEVar1 = local_48.last_;
            }
          }
          local_48.last_ = pEVar1;
          local_48.size_ = local_48.size_ - 1;
          (pEVar5->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
          (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
          pos.node_ = (Expr *)0x0;
          pos.list_ = exprs;
          local_50._M_head_impl = pEVar5;
          intrusive_list<wabt::Expr>::insert
                    (exprs,pos,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_50
                    );
          if (local_50._M_head_impl != (Expr *)0x0) {
            (*(local_50._M_head_impl)->_vptr_Expr[1])();
          }
          local_50._M_head_impl = (Expr *)0x0;
          pEVar5 = pEVar2;
        }
      }
      else {
        RVar4 = Synchronize(this,anon_unknown_1::IsExpr);
        if (RVar4.enum_ == Error) {
          EVar6 = Error;
          pEVar5 = local_48.first_;
          goto joined_r0x001396a4;
        }
      }
      bVar3 = PeekMatchExpr(this);
    } while (bVar3);
    EVar6 = Ok;
    pEVar5 = local_48.first_;
joined_r0x001396a4:
    while (pEVar5 != (Expr *)0x0) {
      pEVar2 = (pEVar5->super_intrusive_list_base<wabt::Expr>).next_;
      (*pEVar5->_vptr_Expr[1])();
      pEVar5 = pEVar2;
    }
  }
  return (Result)EVar6;
}

Assistant:

Result WastParser::ParseExprList(ExprList* exprs) {
  WABT_TRACE(ParseExprList);
  ExprList new_exprs;
  while (PeekMatchExpr()) {
    if (Succeeded(ParseExpr(&new_exprs))) {
      exprs->splice(exprs->end(), new_exprs);
    } else {
      CHECK_RESULT(Synchronize(IsExpr));
    }
  }
  return Result::Ok;
}